

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O1

int AF_A_LeafSpawn(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *pAVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined4 extraout_var;
  undefined8 uVar12;
  PClass *pPVar13;
  PClassActor *type;
  AActor *this;
  char *pcVar14;
  bool bVar15;
  DVector2 v;
  DVector3 local_58;
  double local_40;
  double dStack_38;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar14 = "(paramnum) < numparam";
    goto LAB_005ba84f;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    pAVar2 = (AActor *)(param->field_0).field_1.a;
    if (pAVar2 != (AActor *)0x0) {
      if ((pAVar2->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(pAVar2->super_DThinker).super_DObject._vptr_DObject)(pAVar2);
        (pAVar2->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar13 = (pAVar2->super_DThinker).super_DObject.Class;
      bVar15 = pPVar13 != (PClass *)0x0;
      if (pPVar13 != pPVar4 && bVar15) {
        do {
          pPVar13 = pPVar13->ParentClass;
          bVar15 = pPVar13 != (PClass *)0x0;
          if (pPVar13 == pPVar4) break;
        } while (pPVar13 != (PClass *)0x0);
      }
      if (!bVar15) {
        pcVar14 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005ba84f;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005ba824;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar12 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar12;
        }
        pPVar13 = (PClass *)puVar3[1];
        bVar15 = pPVar13 != (PClass *)0x0;
        if (pPVar13 != pPVar4 && bVar15) {
          do {
            pPVar13 = pPVar13->ParentClass;
            bVar15 = pPVar13 != (PClass *)0x0;
            if (pPVar13 == pPVar4) break;
          } while (pPVar13 != (PClass *)0x0);
        }
        if (!bVar15) {
          pcVar14 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005ba84f;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      uVar6 = FRandom::GenRand32(&pr_leaf);
      iVar5 = (uVar6 & 3) + 1;
      do {
        uVar6 = FRandom::GenRand32(&pr_leaf);
        uVar7 = FRandom::GenRand32(&pr_leaf);
        uVar8 = FRandom::GenRand32(&pr_leaf);
        uVar9 = FRandom::GenRand32(&pr_leaf);
        uVar10 = FRandom::GenRand32(&pr_leaf);
        uVar11 = FRandom::GenRand32(&pr_leaf);
        pcVar14 = "Leaf1";
        if ((uVar11 & 1) == 0) {
          pcVar14 = "Leaf2";
        }
        type = PClass::FindActor(pcVar14);
        P_GetOffsetPosition((pAVar2->__Pos).X,(pAVar2->__Pos).Y,
                            (double)(int)((uVar6 & 0xff) - (uVar7 & 0xff)) * 0.25,
                            (double)(int)((uVar8 & 0xff) - (uVar9 & 0xff)) * 0.25);
        local_58.Z = (double)(uVar10 & 0xff) * 0.25 + (pAVar2->__Pos).Z;
        local_58.X = local_40;
        local_58.Y = dStack_38;
        this = AActor::StaticSpawn(type,&local_58,ALLOW_REPLACE,false);
        if (this != (AActor *)0x0) {
          uVar6 = FRandom::GenRand32(&pr_leaf);
          AActor::Thrust(this,(double)(uVar6 & 0xff) * 0.0078125 + 3.0);
          (this->target).field_0.p = pAVar2;
          this->special1 = 0;
        }
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      return 0;
    }
    pcVar14 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005ba824:
    pcVar14 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005ba84f:
  __assert_fail(pcVar14,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                ,0xd2,"int AF_A_LeafSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LeafSpawn)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	int i;

	for (i = (pr_leaf()&3)+1; i; i--)
	{
		double xo = pr_leaf.Random2() / 4.;
		double yo = pr_leaf.Random2() / 4.;
		double zo = pr_leaf() / 4.;
		mo = Spawn (pr_leaf()&1 ? PClass::FindActor ("Leaf1") : PClass::FindActor ("Leaf2"),
			self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);

		if (mo)
		{
			mo->Thrust(pr_leaf() / 128. + 3);
			mo->target = self;
			mo->special1 = 0;
		}
	}
	return 0;
}